

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O1

bool __thiscall absl::lts_20250127::Mutex::TryLockSlow(Mutex *this)

{
  ulong uVar1;
  GraphId id;
  SynchLocksHeld *held_locks;
  bool bVar2;
  int ev;
  bool bVar3;
  
  uVar1 = (this->mu_).super___atomic_base<long>._M_i;
  ev = 1;
  if ((uVar1 & 9) == 0) {
    bVar2 = false;
    LOCK();
    bVar3 = uVar1 == (this->mu_).super___atomic_base<long>._M_i;
    if (bVar3) {
      (this->mu_).super___atomic_base<long>._M_i = uVar1 | 8;
    }
    UNLOCK();
    if (bVar3) {
      bVar2 = true;
      if (_ZN4absl12lts_2025012712_GLOBAL__N_124synch_deadlock_detectionE_0 != 0) {
        id = GetGraphId(this);
        held_locks = Synch_GetAllLocks();
        LockEnter(this,id,held_locks);
      }
      ev = 0;
    }
  }
  else {
    bVar2 = false;
  }
  PostSynchEvent(this,ev);
  return bVar2;
}

Assistant:

ABSL_ATTRIBUTE_NOINLINE bool Mutex::TryLockSlow() {
  intptr_t v = mu_.load(std::memory_order_relaxed);
  if ((v & kExclusive->slow_need_zero) == 0 &&  // try fast acquire
      mu_.compare_exchange_strong(
          v, (kExclusive->fast_or | v) + kExclusive->fast_add,
          std::memory_order_acquire, std::memory_order_relaxed)) {
    DebugOnlyLockEnter(this);
    PostSynchEvent(this, SYNCH_EV_TRYLOCK_SUCCESS);
    ABSL_TSAN_MUTEX_POST_LOCK(this, __tsan_mutex_try_lock, 0);
    return true;
  }
  PostSynchEvent(this, SYNCH_EV_TRYLOCK_FAILED);
  ABSL_TSAN_MUTEX_POST_LOCK(
      this, __tsan_mutex_try_lock | __tsan_mutex_try_lock_failed, 0);
  return false;
}